

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O1

HighsDebugStatus __thiscall
HEkkPrimal::debugPrimalSteepestEdgeWeights(HEkkPrimal *this,HighsInt alt_debug_level)

{
  vector<double,_std::allocator<double>_> *__x;
  HighsInt size_;
  uint32_t sup;
  uint32_t iVar;
  uint uVar1;
  HighsDebugStatus HVar2;
  ulong uVar3;
  long lVar4;
  HighsInt iCheck;
  int iVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  vector<signed_char,_std::allocator<signed_char>_> nonbasic_flag;
  vector<double,_std::allocator<double>_> updated_primal_edge_weight;
  HVector local_col_aq;
  double local_148;
  double local_140;
  vector<signed_char,_std::allocator<signed_char>_> local_138;
  vector<double,_std::allocator<double>_> local_120;
  double local_108;
  undefined8 uStack_100;
  double local_f8;
  undefined8 uStack_f0;
  HVectorBase<double> local_e0;
  
  if (alt_debug_level < 0) {
    alt_debug_level = (this->ekk_instance_->options_->super_HighsOptionsStruct).highs_debug_level;
  }
  if (alt_debug_level < 2) {
    return kNotChecked;
  }
  size_ = (this->ekk_instance_->lp_).num_row_;
  std::vector<signed_char,_std::allocator<signed_char>_>::vector
            (&local_138,&(this->ekk_instance_->basis_).nonbasicFlag_);
  local_e0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_e0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  local_e0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_e0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_e0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_e0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_e0.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_e0.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_e0.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_e0.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_e0.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_e0.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_e0.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_e0.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_e0.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_e0.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e0.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e0.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  HVectorBase<double>::setup(&local_e0,size_);
  if (alt_debug_level == 2) {
    iVar5 = this->num_tot;
    local_148 = 0.0;
    local_140 = 0.0;
    if (0 < (long)iVar5) {
      lVar4 = 0;
      do {
        local_140 = local_140 +
                    ABS((double)(int)local_138.
                                     super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                     _M_impl.super__Vector_impl_data._M_start[lVar4] *
                        (this->edge_weight_).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar4]);
        lVar4 = lVar4 + 1;
      } while (iVar5 != lVar4);
    }
    uVar1 = 1;
    if (1 < iVar5 / 10) {
      uVar1 = iVar5 / 10;
    }
    uVar3 = 10;
    if (iVar5 < 100) {
      uVar3 = (ulong)uVar1;
    }
    iVar5 = 0;
    do {
      do {
        sup = this->num_tot;
        iVar = 0;
        if (1 < (int)sup) {
          uVar1 = 0x1f;
          if (sup - 1 != 0) {
            for (; sup - 1 >> uVar1 == 0; uVar1 = uVar1 - 1) {
            }
          }
          iVar = HighsRandom::drawUniform(&this->random_,sup,(uVar1 ^ 0xffffffe0) + 0x21);
        }
      } while (local_138.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_start[(int)iVar] == '\0');
      dVar7 = computePrimalSteepestEdgeWeight(this,iVar,&local_e0);
      local_148 = local_148 +
                  ABS((this->edge_weight_).super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start[(int)iVar] - dVar7);
      iVar5 = iVar5 + 1;
    } while (iVar5 != (int)uVar3);
  }
  else {
    uVar3 = (ulong)(uint)this->num_col;
    __x = &this->edge_weight_;
    std::vector<double,_std::allocator<double>_>::vector(&local_120,__x);
    computePrimalSteepestEdgeWeights(this);
    if (this->num_tot < 1) {
      local_148 = 0.0;
      local_140 = 0.0;
    }
    else {
      local_140 = 0.0;
      uVar6 = 0;
      local_148 = 0.0;
      do {
        if (local_138.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_start[uVar6] != '\0') {
          dVar7 = (__x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar6];
          dVar8 = ABS(local_120.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar6] - dVar7);
          if (0.0001 < dVar8) {
            uStack_f0 = 0;
            uStack_100 = 0;
            local_108 = dVar8;
            local_f8 = dVar7;
            printf("debugPrimalSteepestEdgeWeights: var = %2d; weight (true = %10.4g; updated = %10.4g) error = %10.4g\n"
                   ,dVar7,local_120.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar6],dVar8,uVar6 & 0xffffffff);
            dVar7 = local_f8;
            dVar8 = local_108;
          }
          local_140 = local_140 + ABS(dVar7);
          local_148 = local_148 + dVar8;
        }
        uVar6 = uVar6 + 1;
      } while ((long)uVar6 < (long)this->num_tot);
    }
    std::vector<double,_std::allocator<double>_>::operator=(__x,&local_120);
    if (local_120.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_120.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  local_148 = local_148 / local_140;
  if (this->debug_max_relative_primal_steepest_edge_weight_error * 10.0 < local_148) {
    printf("HEkk::debugPrimalSteepestEdgeWeights Iteration %5d: Checked %2d weights: error = %10.4g; norm = %10.4g; relative error = %10.4g\n"
           ,(ulong)(uint)this->ekk_instance_->iteration_count_,uVar3);
    this->debug_max_relative_primal_steepest_edge_weight_error = local_148;
    HVar2 = kLargeError;
    if (0.001 < local_148) goto LAB_0036393a;
  }
  HVar2 = kOk;
LAB_0036393a:
  if (local_e0.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e0.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e0.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e0.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e0.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_e0.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_138.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return HVar2;
}

Assistant:

HighsDebugStatus HEkkPrimal::debugPrimalSteepestEdgeWeights(
    const HighsInt alt_debug_level) {
  const HighsInt use_debug_level =
      alt_debug_level >= 0 ? alt_debug_level
                           : ekk_instance_.options_->highs_debug_level;
  if (use_debug_level < kHighsDebugLevelCostly)
    return HighsDebugStatus::kNotChecked;
  const HighsLp& lp = ekk_instance_.lp_;
  const HighsInt num_row = lp.num_row_;
  const std::vector<int8_t> nonbasic_flag = ekk_instance_.basis_.nonbasicFlag_;
  double primal_steepest_edge_weight_norm = 0;
  double primal_steepest_edge_weight_error = 0;
  HighsInt num_check_weight;
  HVector local_col_aq;
  local_col_aq.setup(num_row);
  if (use_debug_level < kHighsDebugLevelExpensive) {
    for (HighsInt iVar = 0; iVar < num_tot; iVar++) {
      primal_steepest_edge_weight_norm +=
          std::fabs(nonbasic_flag[iVar] * edge_weight_[iVar]);
    }
    // Just check a few weights
    num_check_weight =
        std::max((HighsInt)1, std::min((HighsInt)10, num_tot / 10));
    for (HighsInt iCheck = 0; iCheck < num_check_weight; iCheck++) {
      HighsInt iVar;
      for (;;) {
        iVar = random_.integer(num_tot);
        if (nonbasic_flag[iVar]) break;
      }
      const double true_weight =
          computePrimalSteepestEdgeWeight(iVar, local_col_aq);
      primal_steepest_edge_weight_error +=
          std::fabs(edge_weight_[iVar] - true_weight);
    }
  } else {
    // Check all weights
    num_check_weight = num_col;
    std::vector<double> updated_primal_edge_weight = edge_weight_;
    computePrimalSteepestEdgeWeights();
    for (HighsInt iVar = 0; iVar < num_tot; iVar++) {
      if (!nonbasic_flag[iVar]) continue;
      primal_steepest_edge_weight_norm += std::fabs(edge_weight_[iVar]);
      const double error =
          std::fabs(updated_primal_edge_weight[iVar] - edge_weight_[iVar]);
      if (error > 1e-4)
        printf(
            "debugPrimalSteepestEdgeWeights: var = %2d; weight (true = %10.4g; "
            "updated = %10.4g) error = %10.4g\n",
            (int)iVar, edge_weight_[iVar], updated_primal_edge_weight[iVar],
            error);
      primal_steepest_edge_weight_error += error;
    }
    edge_weight_ = updated_primal_edge_weight;
  }
  // Now assess the relative error
  assert(primal_steepest_edge_weight_norm > 0);
  double relative_primal_steepest_edge_weight_error =
      primal_steepest_edge_weight_error / primal_steepest_edge_weight_norm;
  const double large_relative_primal_steepest_edge_weight_error = 1e-3;
  if (relative_primal_steepest_edge_weight_error >
      10 * debug_max_relative_primal_steepest_edge_weight_error) {
    printf(
        "HEkk::debugPrimalSteepestEdgeWeights Iteration %5d: Checked %2d "
        "weights: "
        "error = %10.4g; norm = %10.4g; relative error = %10.4g\n",
        (int)ekk_instance_.iteration_count_, (int)num_check_weight,
        primal_steepest_edge_weight_error, primal_steepest_edge_weight_norm,
        relative_primal_steepest_edge_weight_error);
    debug_max_relative_primal_steepest_edge_weight_error =
        relative_primal_steepest_edge_weight_error;
    if (relative_primal_steepest_edge_weight_error >
        large_relative_primal_steepest_edge_weight_error)
      return HighsDebugStatus::kLargeError;
  }
  return HighsDebugStatus::kOk;
}